

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

size_t __thiscall VFS::CVFS::CVFSFile::Read(CVFSFile *this,char *Buf,size_t Size,size_t CurPos)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  char *__dest;
  time_t tVar6;
  size_t local_88;
  mutex_type *local_80;
  time_point local_68;
  int local_60;
  int local_5c;
  mutex_type *pmStack_58;
  int CopyCount;
  size_t Pos;
  Chunk c;
  size_t Readed;
  size_t ChunkPos;
  lock_guard<std::mutex> lock;
  size_t CurPos_local;
  size_t Size_local;
  char *Buf_local;
  CVFSFile *this_local;
  
  lock._M_device = (mutex_type *)CurPos;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&ChunkPos,&(this->super_CVFSNode).m_UpdateLock);
  Readed = (ulong)lock._M_device >> 0xc;
  c.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    if ((Size <= c.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi) ||
       (sVar3 = std::
                vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
                ::size(&this->m_Data), sVar3 <= Readed)) break;
    pvVar4 = std::
             vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
             ::operator[](&this->m_Data,Readed);
    std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>::shared_ptr
              ((shared_ptr<VFS::CVFS::CVFSFile::SChunk> *)&Pos,pvVar4);
    local_80 = (mutex_type *)((long)lock._M_device + Readed * -0x1000);
    if ((mutex_type *)0x1000 < local_80) {
      local_80 = (mutex_type *)0x0;
    }
    pmStack_58 = local_80;
    peVar5 = std::
             __shared_ptr_access<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&Pos);
    iVar2 = peVar5->Filled - (int)pmStack_58;
    local_88 = Size;
    if ((ulong)(long)iVar2 <= Size) {
      local_88 = (size_t)iVar2;
    }
    local_5c = (int)local_88;
    if (local_5c < 1) {
      local_60 = 3;
    }
    else {
      __dest = Buf + (long)c.
                           super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
      peVar5 = std::
               __shared_ptr_access<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&Pos);
      memcpy(__dest,peVar5->Data + (long)pmStack_58,(long)local_5c);
      c.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(c.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)local_5c);
      Readed = Readed + 1;
      local_60 = 0;
    }
    std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>::~shared_ptr
              ((shared_ptr<VFS::CVFS::CVFSFile::SChunk> *)&Pos);
  } while (local_60 == 0);
  local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar6 = std::chrono::_V2::system_clock::to_time_t(&local_68);
  _Var1 = c.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (this->super_CVFSNode).m_Accessed = tVar6;
  local_60 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ChunkPos);
  return (size_t)_Var1._M_pi;
}

Assistant:

size_t Read(char *Buf, size_t Size, size_t CurPos)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);

                        size_t ChunkPos = CurPos / CHUNK_SIZE; //Calculates the beginning chunk.
                        size_t Readed = 0;

                        while (Readed < Size)
                        {
                            if(ChunkPos >= m_Data.size())
                                break;

                            Chunk c = m_Data[ChunkPos];
                            size_t Pos = CurPos - ChunkPos * CHUNK_SIZE;
                            Pos = (Pos > CHUNK_SIZE) ? 0 : Pos;

                            int CopyCount = c->Filled - Pos;
                            CopyCount = CopyCount > Size ? Size : CopyCount;    //Calculate the right copy size.
                            if(CopyCount <= 0)
                                break;

                            memcpy(Buf + Readed, c->Data + Pos, CopyCount);
                            Readed += CopyCount;
                            ChunkPos++;
                        }
                        
                        m_Accessed = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
                        return Readed;
                    }